

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O0

void Tim_ManStop(Tim_Man_t *p)

{
  Tim_Man_t *p_local;
  
  Vec_PtrFreeFree(p->vDelayTables);
  Vec_PtrFreeP(&p->vBoxes);
  Mem_FlexStop(p->pMemObj,0);
  if (p->pCis != (Tim_Obj_t *)0x0) {
    free(p->pCis);
    p->pCis = (Tim_Obj_t *)0x0;
  }
  if (p->pCos != (Tim_Obj_t *)0x0) {
    free(p->pCos);
    p->pCos = (Tim_Obj_t *)0x0;
  }
  if (p != (Tim_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Tim_ManStop( Tim_Man_t * p )
{
    Vec_PtrFreeFree( p->vDelayTables );
    Vec_PtrFreeP( &p->vBoxes );
    Mem_FlexStop( p->pMemObj, 0 );
    ABC_FREE( p->pCis );
    ABC_FREE( p->pCos );
    ABC_FREE( p );
}